

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_speed_test.cc
# Opt level: O2

void __thiscall (anonymous_namespace)::CpuSpeedTest::PreEncodeFrameHook(CpuSpeedTest *this)

{
  Encoder *in_RDX;
  VideoSource *in_RSI;
  
  anon_unknown.dwarf_e7848f::CpuSpeedTest::PreEncodeFrameHook
            ((CpuSpeedTest *)(this + -0x18),in_RSI,in_RDX);
  return;
}

Assistant:

void PreEncodeFrameHook(::libaom_test::VideoSource *video,
                          ::libaom_test::Encoder *encoder) override {
    if (video->frame() == 0) {
      encoder->Control(AOME_SET_CPUUSED, set_cpu_used_);
      encoder->Control(AV1E_SET_TUNE_CONTENT, tune_content_);
      if (encoding_mode_ != ::libaom_test::kRealTime) {
        encoder->Control(AOME_SET_ENABLEAUTOALTREF, 1);
        encoder->Control(AOME_SET_ARNR_MAXFRAMES, 7);
        encoder->Control(AOME_SET_ARNR_STRENGTH, 5);
      }
    }
  }